

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype QtPrivate::qustrlen(char16_t *str)

{
  char16_t *pcVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  short *psVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar3 = (uint)str & 0xf;
  psVar5 = (short *)((long)str - (ulong)((uint)str & 0xe));
  auVar6._0_2_ = -(ushort)(*psVar5 == 0);
  auVar6._2_2_ = -(ushort)(psVar5[1] == 0);
  auVar6._4_2_ = -(ushort)(psVar5[2] == 0);
  auVar6._6_2_ = -(ushort)(psVar5[3] == 0);
  auVar6._8_2_ = -(ushort)(psVar5[4] == 0);
  auVar6._10_2_ = -(ushort)(psVar5[5] == 0);
  auVar6._12_2_ = -(ushort)(psVar5[6] == 0);
  auVar6._14_2_ = -(ushort)(psVar5[7] == 0);
  uVar2 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                   (ushort)((byte)(auVar6._14_2_ >> 7) & 1) << 0xe | auVar6._14_2_ & 0x8000) >>
          (sbyte)uVar3;
  if (uVar2 != 0) {
    uVar3 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    return (ulong)(uVar3 >> 1);
  }
  lVar4 = -(ulong)(uVar3 >> 1);
  do {
    pcVar1 = str + lVar4 + 8;
    auVar7._0_2_ = -(ushort)(*pcVar1 == L'\0');
    auVar7._2_2_ = -(ushort)(pcVar1[1] == L'\0');
    auVar7._4_2_ = -(ushort)(pcVar1[2] == L'\0');
    auVar7._6_2_ = -(ushort)(pcVar1[3] == L'\0');
    auVar7._8_2_ = -(ushort)(pcVar1[4] == L'\0');
    auVar7._10_2_ = -(ushort)(pcVar1[5] == L'\0');
    auVar7._12_2_ = -(ushort)(pcVar1[6] == L'\0');
    auVar7._14_2_ = -(ushort)(pcVar1[7] == L'\0');
    lVar4 = lVar4 + 8;
    uVar2 = (ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
            (ushort)((byte)(auVar7._14_2_ >> 7) & 1) << 0xe | auVar7._14_2_ & 0x8000;
  } while (uVar2 == 0);
  uVar3 = 0;
  if (uVar2 != 0) {
    for (; (uVar2 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
    }
  }
  return (ulong)(uVar3 >> 1) + lVar4;
}

Assistant:

[[maybe_unused]] ATTRIBUTE_NO_SANITIZE
static qsizetype qustrlen_sse2(const char16_t *str) noexcept
{
    // find the 16-byte alignment immediately prior or equal to str
    quintptr misalignment = quintptr(str) & 0xf;
    Q_ASSERT((misalignment & 1) == 0);
    const char16_t *ptr = str - (misalignment / 2);

    // load 16 bytes and see if we have a null
    // (aligned loads can never segfault)
    const __m128i zeroes = _mm_setzero_si128();
    __m128i data = _mm_load_si128(reinterpret_cast<const __m128i *>(ptr));
    __m128i comparison = _mm_cmpeq_epi16(data, zeroes);
    uint mask = _mm_movemask_epi8(comparison);

    // ignore the result prior to the beginning of str
    mask >>= misalignment;

    // Have we found something in the first block? Need to handle it now
    // because of the left shift above.
    if (mask)
        return qCountTrailingZeroBits(mask) / sizeof(char16_t);

    constexpr qsizetype Step = sizeof(__m128i) / sizeof(char16_t);
    qsizetype size = Step - misalignment / sizeof(char16_t);

    size -= Step;
    do {
        size += Step;
        data = _mm_load_si128(reinterpret_cast<const __m128i *>(str + size));

        comparison = _mm_cmpeq_epi16(data, zeroes);
        mask = _mm_movemask_epi8(comparison);
    } while (mask == 0);

    // found a null
    return size + qCountTrailingZeroBits(mask) / sizeof(char16_t);
}